

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomStamp.cpp
# Opt level: O3

void __thiscall OpenMD::AtomStamp::validate(AtomStamp *this)

{
  pointer pcVar1;
  long lVar2;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->Type).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    pcVar1 = (this->Type).data_._M_dataplus._M_p;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (this->Type).data_._M_string_length);
    lVar2 = local_58;
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    if (lVar2 == 0) {
      pcVar1 = (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,local_60,local_58 + (long)local_60);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,local_40[0]);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void AtomStamp::validate() {
    DataHolder::validate();
    CheckParameter(Type, isNotEmpty());
  }